

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

string * __thiscall
tinyusdz::tydra::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tydra *this,VertexVariability v)

{
  VertexVariability v_local;
  string *s;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch((ulong)this & 0xffffffff) {
  case 0:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"constant");
    break;
  case 1:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"uniform");
    break;
  case 2:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"varying");
    break;
  case 3:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"vertex");
    break;
  case 4:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"facevarying");
    break;
  case 5:
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"indexed");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(VertexVariability v) {
  std::string s;

  switch (v) {
    case VertexVariability::Constant: {
      s = "constant";
      break;
    }
    case VertexVariability::Uniform: {
      s = "uniform";
      break;
    }
    case VertexVariability::Varying: {
      s = "varying";
      break;
    }
    case VertexVariability::Vertex: {
      s = "vertex";
      break;
    }
    case VertexVariability::FaceVarying: {
      s = "facevarying";
      break;
    }
    case VertexVariability::Indexed: {
      s = "indexed";
      break;
    }
  }

  return s;
}